

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_finish_read
              (png_imagep image,png_const_colorp background,void *buffer,png_int_32 row_stride,
              void *colormap)

{
  int iVar1;
  bool local_a9;
  uint local_a8;
  uint local_9c;
  png_imagep local_98;
  png_image_read_control display;
  int result;
  png_uint_32 png_row_stride;
  png_uint_32 check;
  uint channels;
  void *colormap_local;
  png_int_32 row_stride_local;
  void *buffer_local;
  png_const_colorp background_local;
  png_imagep image_local;
  
  if ((image == (png_imagep)0x0) || (image->version != 1)) {
    if (image == (png_imagep)0x0) {
      image_local._4_4_ = 0;
    }
    else {
      image_local._4_4_ = png_image_error(image,"png_image_finish_read: damaged PNG_IMAGE_VERSION");
    }
  }
  else {
    if ((image->format & 8) == 0) {
      local_9c = (image->format & 3) + 1;
    }
    else {
      local_9c = 1;
    }
    if ((uint)(0x7fffffff / (ulong)local_9c) < image->width) {
      image_local._4_4_ = png_image_error(image,"png_image_finish_read: row_stride too large");
    }
    else {
      display._76_4_ = image->width * local_9c;
      colormap_local._4_4_ = row_stride;
      if (row_stride == 0) {
        colormap_local._4_4_ = display._76_4_;
      }
      if ((int)colormap_local._4_4_ < 0) {
        result = -colormap_local._4_4_;
      }
      else {
        result = colormap_local._4_4_;
      }
      if (((image->opaque == (png_controlp)0x0) || (buffer == (void *)0x0)) ||
         ((uint)result < (uint)display._76_4_)) {
        image_local._4_4_ = png_image_error(image,"png_image_finish_read: invalid argument");
      }
      else {
        if ((image->format & 8) == 0) {
          local_a8 = ((image->format & 4) >> 2) + 1;
        }
        else {
          local_a8 = 1;
        }
        if ((uint)((0xffffffff / (ulong)local_a8) / (ulong)(uint)result) < image->height) {
          image_local._4_4_ = png_image_error(image,"png_image_finish_read: image too large");
        }
        else if (((image->format & 8) == 0) ||
                ((image->colormap_entries != 0 && (colormap != (void *)0x0)))) {
          memset(&local_98,0,0x50);
          display.buffer._0_4_ = colormap_local._4_4_;
          display.background = (png_const_colorp)0x0;
          local_98 = image;
          display.image = (png_imagep)buffer;
          display._16_8_ = colormap;
          display.colormap = background;
          if ((image->format & 8) == 0) {
            display.colormap_processing = png_safe_execute(image,png_image_read_direct,&local_98);
          }
          else {
            iVar1 = png_safe_execute(image,png_image_read_colormap,&local_98);
            local_a9 = false;
            if (iVar1 != 0) {
              iVar1 = png_safe_execute(image,png_image_read_colormapped,&local_98);
              local_a9 = iVar1 != 0;
            }
            display.colormap_processing = (int)local_a9;
          }
          png_image_free(image);
          image_local._4_4_ = display.colormap_processing;
        }
        else {
          image_local._4_4_ =
               png_image_error(image,"png_image_finish_read[color-map]: no color-map");
        }
      }
    }
  }
  return image_local._4_4_;
}

Assistant:

int PNGAPI
png_image_finish_read(png_imagep image, png_const_colorp background,
    void *buffer, png_int_32 row_stride, void *colormap)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      /* Check for row_stride overflow.  This check is not performed on the
       * original PNG format because it may not occur in the output PNG format
       * and libpng deals with the issues of reading the original.
       */
      const unsigned int channels = PNG_IMAGE_PIXEL_CHANNELS(image->format);

      /* The following checks just the 'row_stride' calculation to ensure it
       * fits in a signed 32-bit value.  Because channels/components can be
       * either 1 or 2 bytes in size the length of a row can still overflow 32
       * bits; this is just to verify that the 'row_stride' argument can be
       * represented.
       */
      if (image->width <= 0x7fffffffU/channels) /* no overflow */
      {
         png_uint_32 check;
         const png_uint_32 png_row_stride = image->width * channels;

         if (row_stride == 0)
            row_stride = (png_int_32)/*SAFE*/png_row_stride;

         if (row_stride < 0)
            check = (png_uint_32)(-row_stride);

         else
            check = (png_uint_32)row_stride;

         /* This verifies 'check', the absolute value of the actual stride
          * passed in and detects overflow in the application calculation (i.e.
          * if the app did actually pass in a non-zero 'row_stride'.
          */
         if (image->opaque != NULL && buffer != NULL && check >= png_row_stride)
         {
            /* Now check for overflow of the image buffer calculation; this
             * limits the whole image size to 32 bits for API compatibility with
             * the current, 32-bit, PNG_IMAGE_BUFFER_SIZE macro.
             *
             * The PNG_IMAGE_BUFFER_SIZE macro is:
             *
             *    (PNG_IMAGE_PIXEL_COMPONENT_SIZE(fmt)*height*(row_stride))
             *
             * And the component size is always 1 or 2, so make sure that the
             * number of *bytes* that the application is saying are available
             * does actually fit into a 32-bit number.
             *
             * NOTE: this will be changed in 1.7 because PNG_IMAGE_BUFFER_SIZE
             * will be changed to use png_alloc_size_t; bigger images can be
             * accomodated on 64-bit systems.
             */
            if (image->height <=
                0xffffffffU/PNG_IMAGE_PIXEL_COMPONENT_SIZE(image->format)/check)
            {
               if ((image->format & PNG_FORMAT_FLAG_COLORMAP) == 0 ||
                  (image->colormap_entries > 0 && colormap != NULL))
               {
                  int result;
                  png_image_read_control display;

                  memset(&display, 0, (sizeof display));
                  display.image = image;
                  display.buffer = buffer;
                  display.row_stride = row_stride;
                  display.colormap = colormap;
                  display.background = background;
                  display.local_row = NULL;

                  /* Choose the correct 'end' routine; for the color-map case
                   * all the setup has already been done.
                   */
                  if ((image->format & PNG_FORMAT_FLAG_COLORMAP) != 0)
                     result =
                         png_safe_execute(image,
                             png_image_read_colormap, &display) &&
                             png_safe_execute(image,
                             png_image_read_colormapped, &display);

                  else
                     result =
                        png_safe_execute(image,
                            png_image_read_direct, &display);

                  png_image_free(image);
                  return result;
               }

               else
                  return png_image_error(image,
                      "png_image_finish_read[color-map]: no color-map");
            }

            else
               return png_image_error(image,
                   "png_image_finish_read: image too large");
         }

         else
            return png_image_error(image,
                "png_image_finish_read: invalid argument");
      }

      else
         return png_image_error(image,
             "png_image_finish_read: row_stride too large");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_finish_read: damaged PNG_IMAGE_VERSION");

   return 0;
}